

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O3

void Imf_3_2::anon_unknown_0::hufCanonicalCodeTable(uint64_t *hcode)

{
  ulong uVar1;
  int i_1;
  ulong uVar2;
  ulong uVar3;
  int i;
  long lVar4;
  uint64_t n [59];
  ulong auStack_1e8 [59];
  
  lVar4 = 0;
  memset(auStack_1e8,0,0x1d8);
  do {
    auStack_1e8[hcode[lVar4]] = auStack_1e8[hcode[lVar4]] + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10001);
  uVar2 = 0x3b;
  uVar3 = 0;
  do {
    uVar1 = auStack_1e8[uVar2 - 1];
    auStack_1e8[uVar2 - 1] = uVar3;
    uVar2 = uVar2 - 1;
    uVar3 = uVar1 + uVar3 >> 1;
  } while (1 < uVar2);
  lVar4 = 0;
  do {
    if (0 < (int)(uint)hcode[lVar4]) {
      uVar2 = (ulong)((uint)hcode[lVar4] & 0x7fffffff);
      uVar3 = auStack_1e8[uVar2];
      auStack_1e8[uVar2] = uVar3 + 1;
      hcode[lVar4] = uVar3 << 6 | uVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10001);
  return;
}

Assistant:

void
hufCanonicalCodeTable (uint64_t hcode[HUF_ENCSIZE])
#endif
{
    uint64_t n[59];

    //
    // For each i from 0 through 58, count the
    // number of different codes of length i, and
    // store the count in n[i].
    //

    for (int i = 0; i <= 58; ++i)
        n[i] = 0;

    for (int i = 0; i < HUF_ENCSIZE; ++i)
        n[hcode[i]] += 1;

    //
    // For each i from 58 through 1, compute the
    // numerically lowest code with length i, and
    // store that code in n[i].
    //

    uint64_t c = 0;

    for (int i = 58; i > 0; --i)
    {
        uint64_t nc = ((c + n[i]) >> 1);
        n[i]        = c;
        c           = nc;
    }

    //
    // hcode[i] contains the length, l, of the
    // code for symbol i.  Assign the next available
    // code of length l to the symbol and store both
    // l and the code in hcode[i].
    //

    for (int i = 0; i < HUF_ENCSIZE; ++i)
    {
        int l = hcode[i];

        if (l > 0) hcode[i] = l | (n[l]++ << 6);
    }
}